

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

axis_t __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_axis_name
          (xpath_parser *this,xpath_lexer_string *name,bool *specified)

{
  bool bVar1;
  bool *specified_local;
  xpath_lexer_string *name_local;
  xpath_parser *this_local;
  
  *specified = true;
  switch(*name->begin) {
  case 'a':
    bVar1 = xpath_lexer_string::operator==(name,"ancestor");
    if (bVar1) {
      return axis_ancestor;
    }
    bVar1 = xpath_lexer_string::operator==(name,"ancestor-or-self");
    if (bVar1) {
      return axis_ancestor_or_self;
    }
    bVar1 = xpath_lexer_string::operator==(name,"attribute");
    if (bVar1) {
      return axis_attribute;
    }
    break;
  default:
    break;
  case 'c':
    bVar1 = xpath_lexer_string::operator==(name,"child");
    if (bVar1) {
      return axis_child;
    }
    break;
  case 'd':
    bVar1 = xpath_lexer_string::operator==(name,"descendant");
    if (bVar1) {
      return axis_descendant;
    }
    bVar1 = xpath_lexer_string::operator==(name,"descendant-or-self");
    if (bVar1) {
      return axis_descendant_or_self;
    }
    break;
  case 'f':
    bVar1 = xpath_lexer_string::operator==(name,"following");
    if (bVar1) {
      return axis_following;
    }
    bVar1 = xpath_lexer_string::operator==(name,"following-sibling");
    if (bVar1) {
      return axis_following_sibling;
    }
    break;
  case 'n':
    bVar1 = xpath_lexer_string::operator==(name,"namespace");
    if (bVar1) {
      return axis_namespace;
    }
    break;
  case 'p':
    bVar1 = xpath_lexer_string::operator==(name,"parent");
    if (bVar1) {
      return axis_parent;
    }
    bVar1 = xpath_lexer_string::operator==(name,"preceding");
    if (bVar1) {
      return axis_preceding;
    }
    bVar1 = xpath_lexer_string::operator==(name,"preceding-sibling");
    if (bVar1) {
      return axis_preceding_sibling;
    }
    break;
  case 's':
    bVar1 = xpath_lexer_string::operator==(name,"self");
    if (bVar1) {
      return axis_self;
    }
  }
  *specified = false;
  return axis_child;
}

Assistant:

axis_t parse_axis_name(const xpath_lexer_string& name, bool& specified)
		{
			specified = true;

			switch (name.begin[0])
			{
			case 'a':
				if (name == PUGIXML_TEXT("ancestor"))
					return axis_ancestor;
				else if (name == PUGIXML_TEXT("ancestor-or-self"))
					return axis_ancestor_or_self;
				else if (name == PUGIXML_TEXT("attribute"))
					return axis_attribute;

				break;

			case 'c':
				if (name == PUGIXML_TEXT("child"))
					return axis_child;

				break;

			case 'd':
				if (name == PUGIXML_TEXT("descendant"))
					return axis_descendant;
				else if (name == PUGIXML_TEXT("descendant-or-self"))
					return axis_descendant_or_self;

				break;

			case 'f':
				if (name == PUGIXML_TEXT("following"))
					return axis_following;
				else if (name == PUGIXML_TEXT("following-sibling"))
					return axis_following_sibling;

				break;

			case 'n':
				if (name == PUGIXML_TEXT("namespace"))
					return axis_namespace;

				break;

			case 'p':
				if (name == PUGIXML_TEXT("parent"))
					return axis_parent;
				else if (name == PUGIXML_TEXT("preceding"))
					return axis_preceding;
				else if (name == PUGIXML_TEXT("preceding-sibling"))
					return axis_preceding_sibling;

				break;

			case 's':
				if (name == PUGIXML_TEXT("self"))
					return axis_self;

				break;

			default:
				break;
			}

			specified = false;
			return axis_child;
		}